

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O0

bool FIX::double_conversion::isWhitespace(int x)

{
  int local_18;
  int local_14;
  int i_1;
  int i;
  int x_local;
  
  if (x < 0x80) {
    for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
      if (*(char *)((long)&kWhitespaceTable7 + (long)local_14) == x) {
        return true;
      }
    }
  }
  else {
    for (local_18 = 0; local_18 < 0x14; local_18 = local_18 + 1) {
      if ((uint)*(ushort *)(kWhitespaceTable16 + (long)local_18 * 2) == x) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool isWhitespace(int x) {
#endif
  if (x < 128) {
    for (int i = 0; i < kWhitespaceTable7Length; i++) {
      if (kWhitespaceTable7[i] == x) return true;
    }
  } else {
    for (int i = 0; i < kWhitespaceTable16Length; i++) {
      if (kWhitespaceTable16[i] == x) return true;
    }
  }
  return false;
}